

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

FindInfo __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
::find_first_non_full
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
           *this,size_t hash)

{
  char *pcVar1;
  uint uVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [11];
  undefined1 auVar11 [12];
  undefined1 auVar12 [13];
  undefined1 auVar13 [14];
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  FindInfo FVar14;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_28;
  
  probe(&local_28,this,hash);
  while( true ) {
    pcVar1 = this->ctrl_ + local_28.offset_;
    iVar6 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                   CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar7 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                   CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar8 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                   CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar9 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                   CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -(*pcVar1 < (char)iVar6);
    in_XMM1_Bb = -(pcVar1[1] < (char)((uint)iVar6 >> 8));
    in_XMM1_Bc = -(pcVar1[2] < (char)((uint)iVar6 >> 0x10));
    in_XMM1_Bd = -(pcVar1[3] < (char)((uint)iVar6 >> 0x18));
    in_XMM1_Be = -(pcVar1[4] < (char)iVar7);
    in_XMM1_Bf = -(pcVar1[5] < (char)((uint)iVar7 >> 8));
    in_XMM1_Bg = -(pcVar1[6] < (char)((uint)iVar7 >> 0x10));
    in_XMM1_Bh = -(pcVar1[7] < (char)((uint)iVar7 >> 0x18));
    in_XMM1_Bi = -(pcVar1[8] < (char)iVar8);
    in_XMM1_Bj = -(pcVar1[9] < (char)((uint)iVar8 >> 8));
    in_XMM1_Bk = -(pcVar1[10] < (char)((uint)iVar8 >> 0x10));
    in_XMM1_Bl = -(pcVar1[0xb] < (char)((uint)iVar8 >> 0x18));
    in_XMM1_Bm = -(pcVar1[0xc] < (char)iVar9);
    in_XMM1_Bn = -(pcVar1[0xd] < (char)((uint)iVar9 >> 8));
    in_XMM1_Bo = -(pcVar1[0xe] < (char)((uint)iVar9 >> 0x10));
    in_XMM1_Bp = -(pcVar1[0xf] < (char)((uint)iVar9 >> 0x18));
    auVar4[1] = in_XMM1_Bb;
    auVar4[0] = in_XMM1_Ba;
    auVar4[2] = in_XMM1_Bc;
    auVar4[3] = in_XMM1_Bd;
    auVar4[4] = in_XMM1_Be;
    auVar4[5] = in_XMM1_Bf;
    auVar4[6] = in_XMM1_Bg;
    auVar4[7] = in_XMM1_Bh;
    auVar4[8] = in_XMM1_Bi;
    auVar4[9] = in_XMM1_Bj;
    auVar4[10] = in_XMM1_Bk;
    auVar4[0xb] = in_XMM1_Bl;
    auVar4[0xc] = in_XMM1_Bm;
    auVar4[0xd] = in_XMM1_Bn;
    auVar4[0xe] = in_XMM1_Bo;
    auVar4[0xf] = in_XMM1_Bp;
    auVar5[1] = in_XMM1_Bb;
    auVar5[0] = in_XMM1_Ba;
    auVar5[2] = in_XMM1_Bc;
    auVar5[3] = in_XMM1_Bd;
    auVar5[4] = in_XMM1_Be;
    auVar5[5] = in_XMM1_Bf;
    auVar5[6] = in_XMM1_Bg;
    auVar5[7] = in_XMM1_Bh;
    auVar5[8] = in_XMM1_Bi;
    auVar5[9] = in_XMM1_Bj;
    auVar5[10] = in_XMM1_Bk;
    auVar5[0xb] = in_XMM1_Bl;
    auVar5[0xc] = in_XMM1_Bm;
    auVar5[0xd] = in_XMM1_Bn;
    auVar5[0xe] = in_XMM1_Bo;
    auVar5[0xf] = in_XMM1_Bp;
    auVar13[1] = in_XMM1_Bd;
    auVar13[0] = in_XMM1_Bc;
    auVar13[2] = in_XMM1_Be;
    auVar13[3] = in_XMM1_Bf;
    auVar13[4] = in_XMM1_Bg;
    auVar13[5] = in_XMM1_Bh;
    auVar13[6] = in_XMM1_Bi;
    auVar13[7] = in_XMM1_Bj;
    auVar13[8] = in_XMM1_Bk;
    auVar13[9] = in_XMM1_Bl;
    auVar13[10] = in_XMM1_Bm;
    auVar13[0xb] = in_XMM1_Bn;
    auVar13[0xc] = in_XMM1_Bo;
    auVar13[0xd] = in_XMM1_Bp;
    auVar12[1] = in_XMM1_Be;
    auVar12[0] = in_XMM1_Bd;
    auVar12[2] = in_XMM1_Bf;
    auVar12[3] = in_XMM1_Bg;
    auVar12[4] = in_XMM1_Bh;
    auVar12[5] = in_XMM1_Bi;
    auVar12[6] = in_XMM1_Bj;
    auVar12[7] = in_XMM1_Bk;
    auVar12[8] = in_XMM1_Bl;
    auVar12[9] = in_XMM1_Bm;
    auVar12[10] = in_XMM1_Bn;
    auVar12[0xb] = in_XMM1_Bo;
    auVar12[0xc] = in_XMM1_Bp;
    auVar11[1] = in_XMM1_Bf;
    auVar11[0] = in_XMM1_Be;
    auVar11[2] = in_XMM1_Bg;
    auVar11[3] = in_XMM1_Bh;
    auVar11[4] = in_XMM1_Bi;
    auVar11[5] = in_XMM1_Bj;
    auVar11[6] = in_XMM1_Bk;
    auVar11[7] = in_XMM1_Bl;
    auVar11[8] = in_XMM1_Bm;
    auVar11[9] = in_XMM1_Bn;
    auVar11[10] = in_XMM1_Bo;
    auVar11[0xb] = in_XMM1_Bp;
    auVar10[1] = in_XMM1_Bg;
    auVar10[0] = in_XMM1_Bf;
    auVar10[2] = in_XMM1_Bh;
    auVar10[3] = in_XMM1_Bi;
    auVar10[4] = in_XMM1_Bj;
    auVar10[5] = in_XMM1_Bk;
    auVar10[6] = in_XMM1_Bl;
    auVar10[7] = in_XMM1_Bm;
    auVar10[8] = in_XMM1_Bn;
    auVar10[9] = in_XMM1_Bo;
    auVar10[10] = in_XMM1_Bp;
    uVar3 = (ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB141(auVar13 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar12 >> 7,0) & 1) << 3 |
            (ushort)(SUB121(auVar11 >> 7,0) & 1) << 4 | (ushort)(SUB111(auVar10 >> 7,0) & 1) << 5 |
            (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                     CONCAT18(in_XMM1_Bo,
                                              CONCAT17(in_XMM1_Bn,
                                                       CONCAT16(in_XMM1_Bm,
                                                                CONCAT15(in_XMM1_Bl,
                                                                         CONCAT14(in_XMM1_Bk,
                                                                                  CONCAT13(
                                                  in_XMM1_Bj,
                                                  CONCAT12(in_XMM1_Bi,
                                                           CONCAT11(in_XMM1_Bh,in_XMM1_Bg)))))))))
                           >> 7) & 1) << 6 |
            (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                     CONCAT17(in_XMM1_Bo,
                                              CONCAT16(in_XMM1_Bn,
                                                       CONCAT15(in_XMM1_Bm,
                                                                CONCAT14(in_XMM1_Bl,
                                                                         CONCAT13(in_XMM1_Bk,
                                                                                  CONCAT12(
                                                  in_XMM1_Bj,CONCAT11(in_XMM1_Bi,in_XMM1_Bh))))))))
                           >> 7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf;
    if (uVar3 != 0) {
      uVar2 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      FVar14.offset = local_28.mask_ & local_28.offset_ + uVar2;
      FVar14.probe_length = local_28.index_;
      return FVar14;
    }
    if (this->capacity_ <= local_28.index_) break;
    local_28.offset_ = local_28.offset_ + local_28.index_ + 0x10 & local_28.mask_;
    local_28.index_ = local_28.index_ + 0x10;
  }
  __assert_fail("seq.index() < capacity_ && \"full table!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x7bd,
                "FindInfo phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned int, unsigned long>, phmap::Hash<uint32_t>, phmap::EqualTo<unsigned int>, std::allocator<std::pair<const unsigned int, unsigned long>>>::find_first_non_full(size_t) [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned int, unsigned long>, Hash = phmap::Hash<uint32_t>, Eq = phmap::EqualTo<unsigned int>, Alloc = std::allocator<std::pair<const unsigned int, unsigned long>>]"
               );
}

Assistant:

FindInfo find_first_non_full(size_t hash) {
        auto seq = probe(hash);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            auto mask = g.MatchEmptyOrDeleted();
            if (mask) {
                return {seq.offset(mask.LowestBitSet()), seq.index()};
            }
            assert(seq.index() < capacity_ && "full table!");
            seq.next();
        }
    }